

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getOriginalTemps_abi_cxx11_
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pCVar3;
  string *psVar4;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<AssemblyCode::AssemblyCommand> command;
  CTemp temp;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> local_98;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_88;
  string local_70;
  string local_50 [32];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &((commands->
             super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((commands->
                  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,p_Var5);
    (*(local_98._M_ptr)->_vptr_AssemblyCommand[1])(&local_88);
    pCVar3 = local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar4 = (string *)
                  local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar4 != (string *)pCVar3;
        psVar4 = psVar4 + 0x20) {
      std::__cxx11::string::string(local_50,psVar4);
      IRT::CTemp::ToString_abi_cxx11_(&local_70,(CTemp *)local_50);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_50);
    }
    std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> getOriginalTemps(AssemblyCommands& commands) {
    std::set<std::string> temps;
    for (auto command : commands) {
        for (auto temp : command->GetOut()) {
            temps.insert(temp.ToString());
        }
    }

    return temps;
}